

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

void __thiscall
lest::expected::expected(expected *this,location *where_,string *expr_,string *excpt_)

{
  string local_e8 [32];
  string local_c8 [32];
  location local_a8;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  string *excpt__local;
  string *expr__local;
  location *where__local;
  expected *this_local;
  
  local_28 = excpt_;
  excpt__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"failed: didn\'t get exception",&local_69);
  std::__cxx11::string::string(local_48,local_68);
  location::location(&local_a8,where_);
  std::__cxx11::string::string(local_c8,(string *)expr_);
  std::__cxx11::string::string(local_e8,(string *)excpt_);
  message::message(&this->super_message,(text *)local_48,&local_a8,(text *)local_c8,(text *)local_e8
                  );
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  location::~location(&local_a8);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *(undefined ***)&this->super_message = &PTR__expected_00179768;
  return;
}

Assistant:

expected( location where_, std::string expr_, std::string excpt_ = "" )
    : message{ "failed: didn't get exception", where_, expr_, excpt_} {}